

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::Common::DynamicStringPair::readFrom
          (DynamicStringPair *this,uint8 *buffer,uint32 bufLength)

{
  bool bVar1;
  uint32 value;
  uint32 s;
  uint32 o;
  uint32 bufLength_local;
  uint8 *buffer_local;
  DynamicStringPair *this_local;
  
  value = DynamicString::readFrom(&this->key,buffer,bufLength);
  bVar1 = isError(value);
  this_local._4_4_ = value;
  if (!bVar1) {
    this_local._4_4_ = DynamicString::readFrom(&this->value,buffer + value,bufLength - value);
    bVar1 = isError(this_local._4_4_);
    if (!bVar1) {
      this_local._4_4_ = this_local._4_4_ + value;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 o = key.readFrom(buffer, bufLength);
                    if (isError(o)) return o;
                    uint32 s = value.readFrom(buffer + o, bufLength - o);
                    if (isError(s)) return s;
                    return s+o;
                }